

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::nameSpecStruct(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ASTArray *nodes;
  ASTArray *this_00;
  AST *this_01;
  AST *other;
  AST *this_02;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp72_AST;
  RefAST tmp71_AST;
  RefAST tmp70_AST;
  RefAST X_AST;
  RefAST I_AST;
  RefToken I;
  RefAST N_AST;
  RefToken N;
  RefAST nameSpecStruct_AST;
  ASTPair currentAST;
  AST *in_stack_fffffffffffffdc8;
  AST *in_stack_fffffffffffffdd0;
  AST *in_stack_fffffffffffffdd8;
  AST *in_stack_fffffffffffffde0;
  RefCount<AST> *in_stack_fffffffffffffde8;
  ASTArray *in_stack_fffffffffffffdf0;
  RefToken *in_stack_fffffffffffffe00;
  ASTFactory *in_stack_fffffffffffffe08;
  Parser *in_stack_fffffffffffffe10;
  ASTFactory *in_stack_fffffffffffffe28;
  RefToken *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  RefCount local_138 [63];
  undefined1 local_f9;
  undefined1 local_f8 [8];
  undefined1 local_f0 [24];
  undefined1 local_d8 [31];
  undefined1 local_b9;
  undefined1 local_b8 [8];
  undefined1 local_b0 [31];
  undefined1 local_91;
  undefined1 local_90 [24];
  undefined1 local_78 [24];
  GrpParser *in_stack_ffffffffffffffa0;
  RefCount<AST> local_20 [4];
  
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  ASTPair::ASTPair((ASTPair *)in_stack_fffffffffffffde0);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)in_stack_fffffffffffffde0,
             (RefCount<Token> *)in_stack_fffffffffffffdd8);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)in_stack_fffffffffffffde0,
             (RefCount<Token> *)in_stack_fffffffffffffdd8);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 == 0xd) {
    (**(code **)(*in_RDI + 0x28))(local_78,in_RDI,1);
    RefCount<Token>::operator=
              ((RefCount<Token> *)in_stack_fffffffffffffdf0,
               (RefCount<Token> *)in_stack_fffffffffffffde8);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
    RefCount<Token>::RefCount
              ((RefCount<Token> *)in_stack_fffffffffffffde0,
               (RefCount<Token> *)in_stack_fffffffffffffdd8);
    ASTFactory::create(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
    Parser::match(in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  }
  else {
    if (iVar2 != 0x11) {
      local_91 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_90,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      local_91 = 0;
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    (**(code **)(*in_RDI + 0x28))(&stack0xffffffffffffffa0,in_RDI,1);
    RefCount<Token>::operator=
              ((RefCount<Token> *)in_stack_fffffffffffffdf0,
               (RefCount<Token> *)in_stack_fffffffffffffde8);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
    RefCount<Token>::RefCount
              ((RefCount<Token> *)in_stack_fffffffffffffde0,
               (RefCount<Token> *)in_stack_fffffffffffffdd8);
    ASTFactory::create(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
    Parser::match(in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  (**(code **)(*in_RDI + 0x28))(local_b0,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
  Parser::match(in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 != 0xc) {
    if ((iVar2 != 0xd) && (iVar2 != 0x11)) {
      local_b9 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_b8,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      local_b9 = 0;
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    nameSpecList(in_stack_ffffffffffffffa0);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  (**(code **)(*in_RDI + 0x28))(local_d8,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
  Parser::match(in_stack_fffffffffffffe10,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 == 8) {
    (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffdd8,
                           (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    if (!bVar1) goto LAB_002048fe;
    (**(code **)(*in_RDI + 0x20))(in_RDI,3);
    in_stack_fffffffffffffe57 =
         BitSet::member((BitSet *)in_stack_fffffffffffffdd8,
                        (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    if (!(bool)in_stack_fffffffffffffe57) goto LAB_002048fe;
    RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
    (**(code **)(*in_RDI + 0x28))(local_f0,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
    Parser::match(in_stack_fffffffffffffe10,iVar2);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  }
  else {
LAB_002048fe:
    (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffdd8,
                           (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    if (!bVar1) {
LAB_002049b7:
      local_f9 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_f8,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)
                 CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      local_f9 = 0;
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    (**(code **)(*in_RDI + 0x20))(in_RDI,2);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffdd8,
                           (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    if (!bVar1) goto LAB_002049b7;
    (**(code **)(*in_RDI + 0x20))(in_RDI,3);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffdd8,
                           (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    if (!bVar1) goto LAB_002049b7;
  }
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  nodes = (ASTArray *)operator_new(0x20);
  ASTArray::ASTArray(in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  ASTFactory::create(in_stack_fffffffffffffe28,(int)((ulong)nodes >> 0x20));
  this_00 = ASTArray::add((ASTArray *)in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffde0,&in_stack_fffffffffffffdd8->down);
  ASTFactory::make(in_stack_fffffffffffffe28,nodes);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  bVar1 = false;
  this_01 = RefCount::operator_cast_to_AST_((RefCount *)local_20);
  other = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
  if (this_01 != other) {
    in_stack_fffffffffffffde0 = RefCount<AST>::operator->(local_20);
    AST::getFirstChild(in_stack_fffffffffffffdc8);
    bVar1 = true;
    in_stack_fffffffffffffdd8 = RefCount::operator_cast_to_AST_(local_138);
    in_stack_fffffffffffffdd0 = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
    if (in_stack_fffffffffffffdd8 != in_stack_fffffffffffffdd0) {
      this_02 = RefCount<AST>::operator->(local_20);
      AST::getFirstChild(this_02);
      goto LAB_00204cff;
    }
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffde0->down,&in_stack_fffffffffffffdd8->down);
LAB_00204cff:
  RefCount<AST>::operator=(&this_01->down,&other->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  if (bVar1) {
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  }
  ASTPair::advanceChildToEnd((ASTPair *)this_00);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::operator=(&this_01->down,&other->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffde0);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffdd0->down);
  ASTPair::~ASTPair((ASTPair *)in_stack_fffffffffffffdd0);
  return;
}

Assistant:

void GrpParser::nameSpecStruct() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST nameSpecStruct_AST = nullAST;
	RefToken  N = nullToken;
	RefAST N_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefAST X_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_INT:
		{
			N = LT(1);
			N_AST = astFactory.create(N);
			match(LIT_INT);
			break;
		}
		case IDENT:
		{
			I = LT(1);
			I_AST = astFactory.create(I);
			match(IDENT);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp70_AST = nullAST;
		tmp70_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		case LIT_INT:
		{
			nameSpecList();
			X_AST = returnAST;
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp71_AST = nullAST;
		tmp71_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		{
		if ((LA(1)==OP_SEMI) && (_tokenSet_17.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp72_AST = nullAST;
			tmp72_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if ((_tokenSet_17.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		nameSpecStruct_AST = currentAST.root;
		nameSpecStruct_AST = astFactory.make( (new ASTArray(4))->add(astFactory.create(ZdotStruct))->add(N_AST)->add(I_AST)->add(X_AST));
		currentAST.root = nameSpecStruct_AST;
		currentAST.child = nameSpecStruct_AST!=nullAST &&nameSpecStruct_AST->getFirstChild()!=nullAST ?
			nameSpecStruct_AST->getFirstChild() : nameSpecStruct_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_17);
	}
	returnAST = nameSpecStruct_AST;
}